

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModVerify.cpp
# Opt level: O0

void __thiscall
mod_verify::ModVerifyTest1<unsigned_int>::ModVerifyTest1(ModVerifyTest1<unsigned_int> *this)

{
  ostream *poVar1;
  undefined8 in_RDI;
  SafeIntException *anon_var_0_1;
  uint r_1;
  SafeIntException *anon_var_0;
  uint r;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> m;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> x;
  bool divzero;
  bool expected;
  size_t shift;
  size_t width;
  int *in_stack_fffffffffffffe38;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined8 in_stack_fffffffffffffe50;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [40];
  undefined4 local_b8;
  uint local_b4;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [56];
  undefined4 local_38;
  uint local_34;
  uint local_30;
  undefined4 local_2c;
  undefined4 local_28;
  uint local_24;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_20;
  undefined1 local_1a;
  undefined1 local_19;
  undefined8 local_18;
  undefined8 local_10;
  uint t;
  
  t = (uint)((ulong)in_RDI >> 0x20);
  local_10 = 4;
  local_18 = 0x1f;
  local_19 = 1;
  local_24 = 0x80000000;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_20,&local_24);
  local_2c = 0;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_38 = local_28;
  local_34 = (uint)SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   ::operator%((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                                *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                               (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                                )(uint)in_stack_fffffffffffffe50);
  rhs.m_int = (uint)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  local_30 = SafeInt::operator_cast_to_unsigned_int(in_stack_fffffffffffffe40);
  local_1a = 0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<unsigned_int>();
  poVar1 = std::operator<<(poVar1,local_70);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string(local_70);
  SafeInt::operator_cast_to_unsigned_int(in_stack_fffffffffffffe40);
  to_hex<unsigned_int>(t);
  poVar1 = std::operator<<((ostream *)&std::cerr,local_90);
  poVar1 = std::operator<<(poVar1,", ");
  SafeInt::operator_cast_to_unsigned_int(in_stack_fffffffffffffe40);
  to_hex<unsigned_int>(t);
  poVar1 = std::operator<<(poVar1,local_b0);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_b4 = SafeInt::operator_cast_to_unsigned_int(in_stack_fffffffffffffe40);
  local_b8 = local_28;
  operator%=((uint *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),rhs);
  local_1a = 0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in case ");
  type_name<unsigned_int>();
  poVar1 = std::operator<<(poVar1,local_e0);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::~string(local_e0);
  SafeInt::operator_cast_to_unsigned_int(in_stack_fffffffffffffe40);
  to_hex<unsigned_int>(t);
  poVar1 = std::operator<<((ostream *)&std::cerr,local_100);
  poVar1 = std::operator<<(poVar1,", ");
  SafeInt::operator_cast_to_unsigned_int(in_stack_fffffffffffffe40);
  to_hex<unsigned_int>(t);
  poVar1 = std::operator<<(poVar1,local_120);
  std::operator<<(poVar1,", ");
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_100);
  poVar1 = std::operator<<((ostream *)&std::cerr,"expected = ");
  poVar1 = std::operator<<(poVar1,"divzero");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

ModVerifyTest1<T>()
	{
		const size_t width = sizeof(T);
		const size_t shift = width * CHAR_BIT - 1;
		const bool expected = true;

		bool divzero;
		SafeInt<T> x = (T)((std::uint64_t)1 << shift);
		SafeInt<T> m(0);

		///////////////////////////////////////////////

		try
		{
			T r;
			r = x % m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}

		///////////////////////////////////////////////

		try
		{
			T r = x;
			r %= m;
			divzero = false;
		}
		catch(SafeIntException&)
		{
			divzero = true;
		}

		if(divzero != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "divzero" : "no divzero") << std::endl;
		}
	}